

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

Status * __thiscall leveldb::Status::operator=(Status *this,Status *rhs)

{
  char *pcVar1;
  char *state;
  
  pcVar1 = this->state_;
  state = rhs->state_;
  if (pcVar1 != state) {
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
      state = rhs->state_;
    }
    if (state == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = CopyState(state);
    }
    this->state_ = pcVar1;
  }
  return this;
}

Assistant:

inline Status& Status::operator=(const Status& rhs) {
  // The following condition catches both aliasing (when this == &rhs),
  // and the common case where both rhs and *this are ok.
  if (state_ != rhs.state_) {
    delete[] state_;
    state_ = (rhs.state_ == nullptr) ? nullptr : CopyState(rhs.state_);
  }
  return *this;
}